

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O0

void completeHessian(HighsInt full_dim,HighsHessian *hessian)

{
  HighsInt HVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> *in_RSI;
  int in_EDI;
  HighsInt iCol;
  HighsInt nnz;
  value_type_conflict1 *in_stack_ffffffffffffffd8;
  HighsHessian *in_stack_ffffffffffffffe0;
  
  if (*(int *)&(in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start != in_EDI) {
    HVar1 = HighsHessian::numNz((HighsHessian *)0x6b92f9);
    HighsHessian::exactResize(in_stack_ffffffffffffffe0);
    for (iVar2 = *(int *)&(in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start; iVar2 < in_EDI; iVar2 = iVar2 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (in_RSI,(value_type_conflict2 *)CONCAT44(HVar1,iVar2));
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)0x0,in_stack_ffffffffffffffd8);
      HVar1 = HVar1 + 1;
      std::vector<int,_std::allocator<int>_>::push_back
                (in_RSI,(value_type_conflict2 *)CONCAT44(HVar1,iVar2));
    }
    *(int *)&(in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start = in_EDI;
  }
  return;
}

Assistant:

void completeHessian(const HighsInt full_dim, HighsHessian& hessian) {
  // Ensure that any non-zero Hessian of dimension less than the
  // number of columns in the model is completed with explicit zero
  // diagonal entries
  assert(hessian.dim_ <= full_dim);
  if (hessian.dim_ == full_dim) return;
  HighsInt nnz = hessian.numNz();
  hessian.exactResize();
  for (HighsInt iCol = hessian.dim_; iCol < full_dim; iCol++) {
    hessian.index_.push_back(iCol);
    hessian.value_.push_back(0);
    nnz++;
    hessian.start_.push_back(nnz);
  }
  hessian.dim_ = full_dim;
  assert(HighsInt(hessian.start_.size()) == hessian.dim_ + 1);
}